

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<capnp::StructSchema::Field>::dispose
          (ArrayBuilder<capnp::StructSchema::Field> *this)

{
  Field *pFVar1;
  RemoveConst<capnp::StructSchema::Field> *pRVar2;
  Field *pFVar3;
  
  pFVar1 = this->ptr;
  if (pFVar1 != (Field *)0x0) {
    pRVar2 = this->pos;
    pFVar3 = this->endPtr;
    this->endPtr = (Field *)0x0;
    this->ptr = (Field *)0x0;
    this->pos = (RemoveConst<capnp::StructSchema::Field> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pFVar1,0x40,(long)pRVar2 - (long)pFVar1 >> 6,
               (long)pFVar3 - (long)pFVar1 >> 6,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }